

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O1

_Bool py_attack_real(player *p,loc grid,_Bool *fear)

{
  short sVar1;
  monster_race *pmVar2;
  unarmed_blow *puVar3;
  _Bool _Var4;
  _Bool _Var5;
  wchar_t wVar6;
  wchar_t wVar7;
  uint32_t uVar8;
  wchar_t wVar9;
  uint uVar10;
  int iVar11;
  monster_conflict *mon;
  object *poVar12;
  object *obj;
  char *pcVar13;
  monster *pmVar14;
  bool bVar15;
  ulong uVar16;
  player_blow *ppVar17;
  byte bVar18;
  uint uVar19;
  critical_level *pcVar20;
  uint uVar21;
  bitflag *pbVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  bool bVar28;
  source sVar29;
  source sVar30;
  uint local_f8;
  wchar_t s;
  wchar_t b;
  bitflag *local_e8;
  object *local_e0;
  ulong local_d8;
  uint32_t local_cc;
  char verb [20];
  char dmg_text [20];
  char m_name [80];
  
  mon = (monster_conflict *)square_monster(cave,grid);
  poVar12 = equipped_item_by_slot_name(p,"weapon");
  wVar6 = chance_of_melee_hit(p,poVar12,mon);
  wVar7 = terrain_armor_adjust(grid,mon->race->ac,true);
  my_strcpy(dmg_text,"",0x14);
  my_strcpy(verb,"punch",0x14);
  monster_desc(m_name,0x50,(monster *)mon,L'\x15');
  _Var4 = monster_is_visible((monster *)mon);
  if (_Var4) {
    monster_race_track(p->upkeep,mon->race);
    health_track(p->upkeep,(monster *)mon);
  }
  _Var4 = player_of_has(p,L'\x1c');
  if (_Var4) {
    equip_learn_flag(p,L'\x1c');
    msgt(0x39,"You are too afraid to attack %s!",m_name);
    return false;
  }
  iVar24 = 0;
  local_e0 = poVar12;
  if (mon->m_timed[0] != 0) {
    _Var4 = monster_is_visible((monster *)mon);
    iVar24 = 0;
    if (_Var4) {
      sVar1 = p->lev;
      _Var4 = flag_has_dbg((p->state).pflags,10,0x2a,"p->state.pflags","(PF_BACKSTAB)");
      iVar24 = (int)(short)(sVar1 / 5 + 5) << _Var4;
    }
  }
  monster_wake(mon,false,L'd');
  mon_clear_timed((monster *)mon,L'\x06',L'\x01');
  uVar19 = wVar6 + iVar24;
  uVar21 = uVar19 - wVar7;
  if (uVar19 - wVar7 < 1) {
    uVar21 = 0;
  }
  uVar10 = 0;
  if (0 < (int)uVar19) {
    uVar10 = uVar19;
  }
  (mon->target).midx = L'\xffffffff';
  _Var4 = random_chance_check((random_chance)
                              ((ulong)(((uVar21 * 10000) / uVar10) * 9000) / 10000 + 0x2710000001f4)
                             );
  poVar12 = local_e0;
  if (!_Var4) {
    msgt(3,"You miss %s.",m_name);
    if (p->timed[0x31] == 0) {
      return false;
    }
    uVar8 = Rand_div(0x32);
    if (uVar8 != 0) {
      return false;
    }
    msg("You feel strange...");
    player_over_exert(p,L'\x04',L'\x14',L'\x14');
    return false;
  }
  if (local_e0 != (object *)0x0) {
    object_weight_one(local_e0);
    my_strcpy(verb,"hit",0x14);
  }
  b = L'\0';
  s = L'\0';
  if (2 < (p->body).count) {
    wVar6 = L'\x02';
    do {
      obj = slot_object(p,wVar6);
      if (obj != (object *)0x0) {
        improve_attack_modifier(p,obj,mon,&b,&s,verb,false);
      }
      wVar6 = wVar6 + L'\x01';
    } while ((uint)wVar6 < (uint)(p->body).count);
  }
  if (poVar12 != (object *)0x0) {
    improve_attack_modifier(p,poVar12,mon,&b,&s,verb,false);
  }
  improve_attack_modifier(p,(object *)0x0,mon,&b,&s,verb,false);
  pbVar22 = (p->state).pflags;
  _Var4 = flag_has_dbg(pbVar22,10,0x2b,"p->state.pflags","(PF_UNARMED_COMBAT)");
  local_e8 = pbVar22;
  if ((_Var4) ||
     (_Var4 = flag_has_dbg(pbVar22,10,0x3e,"p->state.pflags","(PF_MARTIAL_ARTS)"), _Var4)) {
    pmVar2 = mon->race;
    wVar6 = (p->state).to_d;
    _Var4 = flag_has_dbg(pbVar22,10,0x3e,"p->state.pflags","(PF_MARTIAL_ARTS)");
    if (((_Var4) && (uVar8 = Rand_div(6), uVar8 == 0)) ||
       ((_Var4 = flag_has_dbg(pbVar22,10,0x3d,"p->state.pflags","(PF_POWER_STRIKE)"), _Var4 &&
        (uVar8 = Rand_div(8), uVar8 == 0)))) {
      bVar18 = 1;
    }
    else {
      bVar18 = 0;
    }
    if (wVar6 < L'\x01') {
      uVar27 = 0;
    }
    else {
      uVar27 = (ulong)""[(uint)wVar6];
    }
    wVar6 = (wchar_t)(short)(p->lev / 10 + 1);
    uVar8 = Rand_div(100);
    iVar25 = (int)(uVar27 / 100);
    iVar25 = iVar25 + (uint)((int)uVar8 < (int)uVar27 + iVar25 * -100) + 2;
    do {
      wVar9 = Rand_div((p->lev * 2) / 5);
      puVar3 = unarmed_blows;
      wVar7 = wVar9 + L'\x01';
      if (wVar9 < wVar6) {
        wVar7 = wVar6;
      }
      wVar6 = wVar7;
      iVar25 = iVar25 + -1;
    } while (iVar25 != 0);
    wVar6 = (uint)(wVar6 < num_unarmed_blows & bVar18) + wVar6;
    if (num_unarmed_blows <= wVar6) {
      wVar6 = num_unarmed_blows;
    }
    _Var4 = flag_has_dbg(local_e8,10,0x4e,"p->state.pflags","(PF_HOLY_LIGHT)");
    uVar21 = 0;
    if (_Var4) {
      pbVar22 = pmVar2->flags;
      _Var4 = flag_has_dbg(pbVar22,0xc,0x49,"race->flags","RF_UNDEAD");
      uVar21 = 2;
      if (!_Var4) {
        _Var4 = flag_has_dbg(pbVar22,0xc,0x4c,"race->flags","RF_HURT_LIGHT");
        uVar21 = 2;
        if (!_Var4) {
          _Var4 = flag_has_dbg(pbVar22,0xc,0x48,"race->flags","RF_EVIL");
          uVar21 = (uint)_Var4;
        }
      }
    }
    iVar25 = puVar3[(long)wVar6 + -1].dd;
    iVar23 = uVar21 + puVar3[(long)wVar6 + -1].ds;
    if (bVar18 == 0) {
      wVar7 = damroll(iVar25,iVar23);
LAB_001b1d2e:
      uVar8 = Rand_div(500);
      if ((int)(uVar8 + 0x19) < (int)uVar19) goto LAB_001b1d3f;
      wVar9 = L'\x02';
      bVar28 = false;
      bVar15 = false;
    }
    else {
      wVar7 = iVar23 * iVar25;
      uVar8 = Rand_div(3);
      if (uVar8 == 0) goto LAB_001b1d2e;
LAB_001b1d3f:
      wVar9 = L'\x02';
      bVar15 = true;
      bVar28 = false;
    }
  }
  else {
    if (poVar12 == (object *)0x0) {
      local_f8 = 1;
    }
    else {
      local_f8 = (uint)poVar12->dd;
    }
    if (poVar12 == (object *)0x0) {
      uVar21 = 10;
    }
    else {
      uVar21 = ((uint)poVar12->ds + (uint)poVar12->ds * 4) * 2 + 10 >> 1;
    }
    if (s == L'\0') {
      if (b == L'\0') {
        uVar27 = 10;
      }
      else {
        wVar6 = get_monster_brand_multiplier(mon,brands + b);
        uVar27 = (ulong)(uint)wVar6;
      }
    }
    else {
      uVar27 = (ulong)(uint)slays[s].multiplier;
    }
    _Var4 = flag_has_dbg((player->state).pflags,10,0x4e,"player->state.pflags","(PF_HOLY_LIGHT)");
    if (_Var4) {
      _Var4 = flag_has_dbg(mon->race->flags,0xc,0x49,"mon->race->flags","RF_UNDEAD");
      iVar25 = (int)uVar27;
      if ((_Var4) ||
         (_Var4 = flag_has_dbg(mon->race->flags,0xc,0x4c,"mon->race->flags","RF_HURT_LIGHT"), _Var4)
         ) {
        iVar23 = iVar25 + 10;
      }
      else {
        _Var4 = flag_has_dbg(mon->race->flags,0xc,0x48,"mon->race->flags","RF_EVIL");
        iVar23 = iVar25;
        if (!_Var4) goto LAB_001b1ebd;
      }
      uVar27 = (ulong)(uint)(iVar23 / 10 + iVar25);
    }
LAB_001b1ebd:
    wVar6 = (p->state).to_d;
    if (poVar12 == (object *)0x0) {
      wVar7 = L'\0';
    }
    else {
      wVar7 = object_to_dam(poVar12);
    }
    uVar10 = wVar7 + wVar6;
    uVar19 = 0x96;
    if ((int)uVar10 < 0x96) {
      uVar19 = uVar10;
    }
    uVar16 = 0xffffff6a;
    if (-0x96 < (int)uVar19) {
      uVar16 = (ulong)uVar19;
    }
    if ((int)uVar10 < 0) {
      iVar25 = 0;
      if (0x77 < (ulong)(uint)-(int)uVar16 - 0x1f) {
        uVar19 = -(uint)""[(uint)-(int)uVar16];
        goto LAB_001b1f2e;
      }
    }
    else {
      uVar19 = (uint)""[uVar16];
LAB_001b1f2e:
      iVar25 = (uVar19 + 100) * uVar21 * (int)uVar27;
    }
    local_cc = Rand_div(10000);
    _Var4 = monster_is_obvious((monster *)mon);
    bVar28 = false;
    if (_Var4) {
      _Var4 = flag_has_dbg(local_e8,10,0x38,"p->state.pflags","(PF_ARMSMAN)");
      bVar28 = false;
      if (_Var4) {
        uVar8 = Rand_div(z_info->m_armsman_chance);
        bVar28 = uVar8 == 0;
      }
    }
    local_d8 = uVar27;
    bVar15 = bVar28;
    if (!bVar28) {
      wVar6 = chance_of_melee_hit(p,poVar12,mon);
      iVar11 = ((wVar6 + iVar24) * z_info->m_crit_power_toh_scl_num) /
               z_info->m_crit_power_toh_scl_den;
      iVar23 = z_info->m_crit_chance_power_scl_num;
      uVar8 = Rand_div(iVar11 * z_info->m_crit_chance_power_scl_den + z_info->m_crit_chance_add_den)
      ;
      bVar15 = (int)uVar8 < iVar23 * iVar11;
    }
    wVar9 = L'\x02';
    if (bVar15) {
      pcVar20 = z_info->m_crit_level_head;
      uVar21 = 0;
      if (pcVar20 != (critical_level *)0x0) {
        while ((pcVar20->next != (critical_level *)0x0 &&
               (uVar8 = Rand_div(pcVar20->chance), uVar8 != 0))) {
          pcVar20 = pcVar20->next;
        }
        uVar21 = pcVar20->added_dice;
        wVar9 = pcVar20->msgt;
      }
    }
    else {
      uVar21 = 0;
    }
    uVar19 = 0;
    if (((uVar21 != 0) &&
        (_Var4 = flag_has_dbg(local_e8,10,0x3f,"p->state.pflags","(PF_MANA_BURN)"), uVar19 = uVar21,
        _Var4)) && (_Var4 = monster_has_non_innate_spells((monster *)mon), _Var4)) {
      flag_on_dbg(mon->mflag,2,0xb,"mon->mflag","MFLAG_LESS_SPELL");
      uVar19 = uVar21 + z_info->m_manaburn_dice;
      msgt(2,"Mana Burn!");
    }
    iVar25 = iVar25 * 2 + -10000;
    iVar25 = damroll(uVar19 + local_f8,(uint)((int)local_cc < iVar25 % 10000) + iVar25 / 10000);
    wVar7 = (int)local_d8 + iVar25 + L'\xfffffff6';
    bVar18 = 0;
    bVar15 = false;
    wVar6 = L'\0';
  }
  _Var4 = player_of_has(p,L'\x11');
  local_d8 = CONCAT71(local_d8._1_7_,L'2' < wVar7 && _Var4);
  if (L'2' < wVar7 && _Var4) {
    equip_learn_flag(p,L'\x11');
  }
  equip_learn_on_melee_attack(p);
  learn_brand_slay_from_melee(p,local_e0,mon);
  _Var4 = player_is_shapechanged(p);
  if (_Var4) {
    uVar8 = Rand_div(p->shape->num_blows);
    ppVar17 = (player_blow *)&p->shape->blows;
    iVar25 = uVar8 + 1;
    do {
      ppVar17 = ppVar17->next;
      iVar25 = iVar25 + -1;
    } while (iVar25 != 0);
    my_strcpy(verb,ppVar17->name,0x14);
  }
  if (wVar7 < L'\x01') {
    my_strcpy(verb,"fail to harm",0x14);
    wVar7 = L'\0';
    wVar9 = L'\x03';
  }
  if ((p->opts).opt[3] == true) {
    pcVar13 = format(" (%d)",(ulong)(uint)wVar7);
    my_strcpy(dmg_text,pcVar13,0x14);
  }
  if ((local_e0 == (object *)0x0) &&
     ((_Var4 = flag_has_dbg(local_e8,10,0x2b,"p->state.pflags","(PF_UNARMED_COMBAT)"), _Var4 ||
      (_Var4 = flag_has_dbg(local_e8,10,0x3e,"p->state.pflags","(PF_MARTIAL_ARTS)"), _Var4)))) {
    if (bVar15) {
      if (bVar18 != 0) {
        msgt(2,"Power Strike! You attempt to confuse %s%s.",m_name,dmg_text);
        goto LAB_001b23d8;
      }
      pcVar13 = "You %s and attempt to confuse %s%s.";
    }
    else if (bVar18 == 0) {
      pcVar13 = "You %s %s%s.";
    }
    else {
      pcVar13 = "Power Strike! You %s %s%s.";
    }
    msgt(2,pcVar13,unarmed_blows[(long)wVar6 + -1].name,m_name,dmg_text);
  }
  else {
    local_e0 = (object *)CONCAT44(local_e0._4_4_,wVar9 + L'\xffffff6d');
    lVar26 = 8;
    do {
      if (wVar9 == *(wchar_t *)(&UNK_00284208 + lVar26)) {
        if ((iVar24 == 0) || (_Var4 = monster_is_visible((monster *)mon), !_Var4)) {
          pcVar13 = "Armsman hit!";
          if (bVar28) goto LAB_001b22af;
        }
        else {
          _Var4 = flag_has_dbg(local_e8,10,0x2a,"p->state.pflags","(PF_BACKSTAB)");
          pcVar13 = "You rudely awaken the monster.";
          if ((uint)local_e0 < 2) {
            pcVar13 = "You ruthlessly sneak attack!";
          }
          if (!_Var4) {
            pcVar13 = "You rudely awaken the monster.";
          }
LAB_001b22af:
          msgt(2,pcVar13);
        }
        if (*(long *)((long)&melee_hit_types[0].msg_type + lVar26) == 0) {
          msgt(wVar9,"You %s %s%s.",verb,m_name,dmg_text);
        }
        else {
          msgt(wVar9,"You %s %s%s. %s",verb,m_name,dmg_text);
        }
      }
      lVar26 = lVar26 + 0x10;
    } while (lVar26 != 0x78);
  }
LAB_001b23d8:
  _Var4 = flag_has_dbg(local_e8,10,0x4a,"p->state.pflags","(PF_FURY)");
  if (_Var4) {
    wVar9 = (p->upkeep->energy_use * 3) /
            (int)((uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                        [(p->state).speed] * 2);
    wVar6 = L'\x01';
    if (L'\x01' < wVar9) {
      wVar6 = wVar9;
    }
    player_add_speed_boost(p,wVar6);
  }
  if (p->timed[0x27] != 0) {
    player_clear_timed(p,L'\'',true,false);
    uVar8 = Rand_div((int)p->lev);
    mon_inc_timed((monster *)mon,L'\x02',(int)uVar8 / 10 + L'\n',L'\x01');
  }
  wVar6 = (int)mon->hp;
  if (wVar7 < mon->hp) {
    wVar6 = wVar7;
  }
  _Var4 = mon_take_hit(mon,p,wVar7,fear,(char *)0x0);
  if ((p->timed[0x31] != 0) && (uVar8 = Rand_div(0x32), uVar8 == 0)) {
    msg("You feel something give way!");
    player_over_exert(p,L'\x01',L'\x14',L'\0');
  }
  if (!_Var4) {
    if ((p->timed[0x2a] != 0) && (_Var5 = monster_is_living((monster *)mon), _Var5)) {
      sVar29 = source_player();
      sVar30.which = sVar29.which;
      pcVar13 = format("%d",(ulong)(uint)wVar6);
      sVar30._4_4_ = 0;
      sVar30.what = sVar29.what;
      effect_simple(L'\x03',sVar30,pcVar13,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    }
    if (!_Var4) goto LAB_001b2561;
  }
  *fear = false;
LAB_001b2561:
  if ((char)local_d8 != '\0') {
    sVar30 = source_player();
    sVar29.which = sVar30.which;
    sVar29._4_4_ = 0;
    sVar29.what = sVar30.what;
    effect_simple(L'A',sVar29,"0",L'\0',L'\n',L'\0',L'\0',L'\0',(_Bool *)0x0);
    pmVar14 = square_monster(cave,grid);
    if (pmVar14 == (monster *)0x0) {
      _Var4 = true;
    }
  }
  return _Var4;
}

Assistant:

bool py_attack_real(struct player *p, struct loc grid, bool *fear)
{
	size_t i;

	/* Information about the target of the attack */
	struct monster *mon = square_monster(cave, grid);
	char m_name[80];
	bool stop = false;

	/* The weapon used */
	struct object *obj = equipped_item_by_slot_name(p, "weapon");

	/* Information about the attack */
	int chance = chance_of_melee_hit(p, obj, mon);
	int drain = 0;
	int splash = 0;
	bool do_quake = false;
	bool success = false;
	bool armsman = false;
	bool power_strike = false;
	bool confusing_blow = false;
	int unarmed_blow_idx = 0;

	/* Bonus to attack if monster is sleeping. */
	int sleeping_bonus = 0;

	int ac = terrain_armor_adjust(grid, mon->race->ac, true);

	char verb[20];
	uint32_t msg_type = MSG_HIT;
	char dmg_text[20];
	int j, b, s, weight, dmg;

	my_strcpy(dmg_text, "", sizeof(dmg_text));

	/* Default to punching */
	my_strcpy(verb, "punch", sizeof(verb));

	/* Extract monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_TARG);

	/* Auto-Recall and track if possible and visible */
	if (monster_is_visible(mon)) {
		monster_race_track(p->upkeep, mon->race);
		health_track(p->upkeep, mon);
	}

	/* Handle player fear (only for invisible monsters) */
	if (player_of_has(p, OF_AFRAID)) {
		equip_learn_flag(p, OF_AFRAID);
		msgt(MSG_AFRAID, "You are too afraid to attack %s!", m_name);
		return false;
	}

	/* If the monster is sleeping and visible, it can be hit more easily. */
	if (mon->m_timed[MON_TMD_SLEEP] && monster_is_visible(mon)) {
		sleeping_bonus = 5 + p->lev / 5;
		if (player_has(p, PF_BACKSTAB)) {
			sleeping_bonus *= 2;
		}
	}

	/* Disturb the monster */
	monster_wake(mon, false, 100);
	mon_clear_timed(mon, MON_TMD_HOLD, MON_TMD_FLG_NOTIFY);

	/* Become hostile */
	mon->target.midx = -1;

	/* See if the player hit */
	success = test_hit(chance + sleeping_bonus, ac);

	/* If a miss, skip this hit */
	if (!success) {
		msgt(MSG_MISS, "You miss %s.", m_name);

		/* Small chance of bloodlust side-effects */
		if (p->timed[TMD_BLOODLUST] && one_in_(50)) {
			msg("You feel strange...");
			player_over_exert(p, PY_EXERT_SCRAMBLE, 20, 20);
		}

		return false;
	}

	if (obj) {
		/* Handle normal weapon */
		weight = object_weight_one(obj);
		my_strcpy(verb, "hit", sizeof(verb));
	} else {
		weight = 0;
	}

	/* Best attack from all slays or brands on all non-launcher equipment */
	b = 0;
	s = 0;
	for (j = 2; j < p->body.count; j++) {
		struct object *obj_local = slot_object(p, j);
		if (obj_local) {
			improve_attack_modifier(p, obj_local, mon, &b, &s, verb, false);
		}
	}

	/* Get the best attack from all slays or brands - weapon or temporary */
	if (obj) {
		improve_attack_modifier(p, obj, mon, &b, &s, verb, false);
	}
	improve_attack_modifier(p, NULL, mon, &b, &s, verb, false);

	if (player_has(p, PF_UNARMED_COMBAT) || player_has(p, PF_MARTIAL_ARTS)) {
		dmg = unarmed_damage(p, mon->race, chance + sleeping_bonus,
							 &unarmed_blow_idx, &power_strike, &confusing_blow);
	} else {
		/* Get the damage */
		dmg = melee_damage(p, mon, obj, b, s, sleeping_bonus, &msg_type,
						   &armsman);
	}

	/* Splash damage and earthquakes */
	splash = (weight * dmg) / 100;
	if (player_of_has(p, OF_IMPACT) && dmg > 50) {
		do_quake = true;
		equip_learn_flag(p, OF_IMPACT);
	}

	/* Learn by use */
	equip_learn_on_melee_attack(p);
	learn_brand_slay_from_melee(p, obj, mon);

	/* Substitute shape-specific blows for shapechanged players */
	if (player_is_shapechanged(p)) {
		int choice = randint0(p->shape->num_blows);
		struct player_blow *blow = p->shape->blows;
		while (choice--) {
			blow = blow->next;
		}
		my_strcpy(verb, blow->name, sizeof(verb));
	}

	/* No negative damage; change verb if no damage done */
	if (dmg <= 0) {
		dmg = 0;
		msg_type = MSG_MISS;
		my_strcpy(verb, "fail to harm", sizeof(verb));
	}

	/* Set damage value text if needed */
	if (OPT(p, show_damage)) {
		my_strcpy(dmg_text, format(" (%d)", dmg), sizeof(dmg_text));
	}

	/* Special messages for unarmed combat */
	if (!obj && (player_has(p, PF_UNARMED_COMBAT) ||
				 player_has(p, PF_MARTIAL_ARTS))) {
		const char *name = unarmed_blows[unarmed_blow_idx - 1].name;

		/* Display the attack message, feedback for relevant specialties */
		if (confusing_blow) {
			if (power_strike) {
				msgt(MSG_HIT, "Power Strike! You attempt to confuse %s%s.",
					 m_name, dmg_text);
			} else {
				msgt(MSG_HIT, "You %s and attempt to confuse %s%s.",
					 name, m_name, dmg_text);
			}
		} else {
			/* Basic attack message. */
			if (power_strike) {
				msgt(MSG_HIT, "Power Strike! You %s %s%s.", name, m_name,
					 dmg_text);
			} else {
				msgt(MSG_HIT, "You %s %s%s.", name, m_name, dmg_text);
			}
		}
	} else {
		for (i = 0; i < N_ELEMENTS(melee_hit_types); i++) {
			if (msg_type != melee_hit_types[i].msg_type) continue;

			/* Encourage the player to beat on sleeping monsters. */
			if (sleeping_bonus && monster_is_visible(mon)) {
				/* More "interesting" messages if we get a seriously good hit */
				if (player_has(p, PF_BACKSTAB) &&
					((msg_type == MSG_HIT_HI_GREAT)
					 || (msg_type == MSG_HIT_HI_SUPERB))) {
					msgt(MSG_HIT, "You ruthlessly sneak attack!");
				} else {
					/* Standard "wakeup call". */
					msgt(MSG_HIT, "You rudely awaken the monster.");
				}
			} else if (armsman) {
				/* Credit where credit is due, if no special message already */
				msgt(MSG_HIT, "Armsman hit!");
			}

			if (melee_hit_types[i].text)
				msgt(msg_type, "You %s %s%s. %s", verb, m_name, dmg_text,
					 melee_hit_types[i].text);
			else
				msgt(msg_type, "You %s %s%s.", verb, m_name, dmg_text);
		}
	}

	/* Specialty ability Fury */
	if (player_has(p, PF_FURY)) {
		fury_boost(p);
	}

	/* Pre-damage side effects */
	blow_side_effects(p, mon);

	/* Damage, check for hp drain, fear and death */
	drain = MIN(mon->hp, dmg);
	stop = mon_take_hit(mon, p, dmg, fear, NULL);

	/* Small chance of bloodlust side-effects */
	if (p->timed[TMD_BLOODLUST] && one_in_(50)) {
		msg("You feel something give way!");
		player_over_exert(p, PY_EXERT_CON, 20, 0);
	}

	if (!stop) {
		if (p->timed[TMD_ATT_VAMP] && monster_is_living(mon)) {
			effect_simple(EF_HEAL_HP, source_player(), format("%d", drain),
						  0, 0, 0, 0, 0, NULL);
		}
	}

	if (stop)
		(*fear) = false;

	/* Post-damage effects */
	if (blow_after_effects(grid, dmg, splash, fear, do_quake))
		stop = true;

	return stop;
}